

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashlin.c
# Opt level: O1

void tommy_hashlin_init(tommy_hashlin *hashlin)

{
  long lVar1;
  tommy_hashlin_node **pptVar2;
  long lVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  hashlin->bucket_bit = 6;
  hashlin->bucket_max = 0x40;
  hashlin->bucket_mask = 0x3f;
  pptVar2 = (tommy_hashlin_node **)calloc(0x40,8);
  hashlin->bucket[0] = pptVar2;
  lVar3 = 1;
  do {
    hashlin->bucket[lVar3] = pptVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 6);
  hashlin->state = 0;
  hashlin->low_max = 0x40;
  hashlin->low_mask = 0x3f;
  hashlin->split = 0;
  hashlin->count = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void tommy_hashlin_init(tommy_hashlin* hashlin)
{
	tommy_uint_t i;

	/* fixed initial size */
	hashlin->bucket_bit = TOMMY_HASHLIN_BIT;
	hashlin->bucket_max = 1 << hashlin->bucket_bit;
	hashlin->bucket_mask = hashlin->bucket_max - 1;
	hashlin->bucket[0] = tommy_cast(tommy_hashlin_node**, tommy_calloc(hashlin->bucket_max, sizeof(tommy_hashlin_node*)));
	for (i = 1; i < TOMMY_HASHLIN_BIT; ++i)
		hashlin->bucket[i] = hashlin->bucket[0];

	/* stable state */
	tommy_hashlin_stable(hashlin);

	hashlin->count = 0;
}